

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O2

void __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>::
TPZGeoElRefLess(TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>
                *this,TPZVec<long> *nodeindices,int matind,TPZGeoMesh *mesh,int64_t *index)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_016e0398;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_016df820,matind,mesh,index);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_016df520;
  pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>::TPZTriangleSphere
            (&this->fGeo,nodeindices);
  lVar1 = 0x938;
  do {
    *(undefined ***)
     ((long)(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoTriangle>.super_TPZGeoTriangle.
            super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes + lVar1 + -0x58) =
         &PTR__TPZGeoElSideIndex_016b1180;
    *(undefined4 *)
     ((long)(&(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoTriangle>.super_TPZGeoTriangle + -2) +
     lVar1) = 0xffffffff;
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoTriangle>.super_TPZGeoTriangle.
            super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes + lVar1 + -0x50) =
         0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x9e0);
  for (lVar1 = 0x938; lVar1 != 0x9e0; lVar1 = lVar1 + 0x18) {
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoTriangle>.super_TPZGeoTriangle.
            super_TPZNodeRep<3,_pztopology::TPZTriangle>.fNodeIndexes + lVar1 + -0x50) =
         0xffffffffffffffff;
    *(undefined4 *)
     ((long)(&(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoTriangle>.super_TPZGeoTriangle + -2) +
     lVar1) = 0xffffffff;
  }
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::Initialize
            (&(this->fGeo).super_TPZGeoBlend<pzgeom::TPZGeoTriangle>,&this->super_TPZGeoEl);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh, int64_t &index) 
: TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh,index) , fGeo(nodeindices) 
{
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}